

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O2

void __thiscall OpenMD::DumpReader::parseDumpLine(DumpReader *this,string *line)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  RigidBody *this_00;
  long lVar4;
  Atom *pAVar5;
  long lVar6;
  ulong uVar7;
  RigidBody *rb;
  RealType RVar8;
  double dVar9;
  Vector3d ji;
  string type;
  StringTokenizer tokenizer;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&type," ;\t\n\r",(allocator<char> *)&ji);
  StringTokenizer::StringTokenizer(&tokenizer,line,&type);
  std::__cxx11::string::~string((string *)&type);
  iVar2 = StringTokenizer::countTokens(&tokenizer);
  if (iVar2 < 2) {
    snprintf(painCave.errMsg,2000,"DumpReader Error: Not enough Tokens.\n%s\n",
             (line->_M_dataplus)._M_p);
    painCave.isFatal = 1;
    simError();
  }
  uVar3 = StringTokenizer::nextTokenAsInt(&tokenizer);
  this_00 = (RigidBody *)SimInfo::getIOIndexToIntegrableObject(this->info_,uVar3);
  if (this_00 != (RigidBody *)0x0) {
    StringTokenizer::nextToken_abi_cxx11_(&type,&tokenizer);
    if ((this->needPos_ == true) &&
       (lVar4 = std::__cxx11::string::find((char *)&type,0x24f722), lVar4 == -1)) {
      snprintf(painCave.errMsg,2000,
               "DumpReader Error: StuntDouble %d has no Position\n\tField (\"p\") specified.\n%s\n",
               (ulong)uVar3,(line->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      simError();
    }
    if ((((this_00->super_StuntDouble).objType_ - otDAtom < 2) && (this->needQuaternion_ == true))
       && (lVar4 = std::__cxx11::string::find((char *)&type,0x246e17), lVar4 == -1)) {
      snprintf(painCave.errMsg,2000,
               "DumpReader Error: Directional StuntDouble %d has no\n\tQuaternion Field (\"q\") specified.\n%s\n"
               ,(ulong)uVar3,(line->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      simError();
    }
    uVar3 = (uint)type._M_string_length;
    if ((int)(uint)type._M_string_length < 1) {
      uVar3 = 0;
    }
    for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      switch(type._M_dataplus._M_p[uVar7]) {
      case 'c':
        RVar8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        if ((this_00->super_StuntDouble).objType_ < otRigidBody) {
          pAVar5 = (Atom *)__dynamic_cast(this_00,&StuntDouble::typeinfo,&Atom::typeinfo,0);
          bVar1 = Atom::isFluctuatingCharge(pAVar5);
          if (bVar1) {
            lVar6 = (long)(this_00->super_StuntDouble).localIndex_;
            lVar4 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).flucQPos.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (this_00->super_StuntDouble).storage_);
            goto LAB_00137049;
          }
        }
        break;
      case 'd':
        RVar8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        lVar6 = (long)(this_00->super_StuntDouble).localIndex_;
        lVar4 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                 atomData).density.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start +
                         (this_00->super_StuntDouble).storage_);
        goto LAB_00137049;
      case 'e':
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&ji);
        ji.super_Vector<double,_3U>.data_[0] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        ji.super_Vector<double,_3U>.data_[1] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        ji.super_Vector<double,_3U>.data_[2] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        if (this->readField_ == true) {
          StuntDouble::setElectricField((StuntDouble *)this_00,&ji);
        }
        break;
      case 'f':
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&ji);
        ji.super_Vector<double,_3U>.data_[0] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        ji.super_Vector<double,_3U>.data_[1] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        ji.super_Vector<double,_3U>.data_[2] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        StuntDouble::setFrc((StuntDouble *)this_00,&ji);
        break;
      case 'g':
        RVar8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        if ((this_00->super_StuntDouble).objType_ < otRigidBody) {
          pAVar5 = (Atom *)__dynamic_cast(this_00,&StuntDouble::typeinfo,&Atom::typeinfo,0);
          bVar1 = Atom::isFluctuatingCharge(pAVar5);
          if (bVar1) {
            lVar6 = (long)(this_00->super_StuntDouble).localIndex_;
            lVar4 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).flucQFrc.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (this_00->super_StuntDouble).storage_);
            goto LAB_00137049;
          }
        }
        break;
      default:
        snprintf(painCave.errMsg,2000,"DumpReader Error: %s is an unrecognized type\n");
        painCave.isFatal = 1;
        simError();
        break;
      case 'j':
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&ji);
        if ((this_00->super_StuntDouble).objType_ - otDAtom < 2) {
          ji.super_Vector<double,_3U>.data_[0] = StringTokenizer::nextTokenAsDouble(&tokenizer);
          ji.super_Vector<double,_3U>.data_[1] = StringTokenizer::nextTokenAsDouble(&tokenizer);
          ji.super_Vector<double,_3U>.data_[2] = StringTokenizer::nextTokenAsDouble(&tokenizer);
          if (this->needAngMom_ == true) {
            StuntDouble::setJ((StuntDouble *)this_00,&ji);
          }
        }
        break;
      case 'p':
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&ji);
        ji.super_Vector<double,_3U>.data_[0] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        ji.super_Vector<double,_3U>.data_[1] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        ji.super_Vector<double,_3U>.data_[2] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        if (this->needPos_ == true) {
          StuntDouble::setPos((StuntDouble *)this_00,&ji);
        }
        break;
      case 'q':
        Vector<double,_4U>::Vector((Vector<double,_4U> *)&ji);
        if ((this_00->super_StuntDouble).objType_ - otDAtom < 2) {
          ji.super_Vector<double,_3U>.data_[0] = StringTokenizer::nextTokenAsDouble(&tokenizer);
          ji.super_Vector<double,_3U>.data_[1] = StringTokenizer::nextTokenAsDouble(&tokenizer);
          ji.super_Vector<double,_3U>.data_[2] = StringTokenizer::nextTokenAsDouble(&tokenizer);
          StringTokenizer::nextTokenAsDouble(&tokenizer);
          dVar9 = Vector<double,_4U>::length((Vector<double,_4U> *)&ji);
          if (dVar9 < 1e-06) {
            memcpy(&painCave,
                   "DumpReader Error: initial quaternion error (q0^2 + q1^2 + q2^2 + q3^2) ~ 0\n",
                   0x4c);
            painCave.isFatal = 1;
            simError();
          }
          Vector<double,_4U>::normalize((Vector<double,_4U> *)&ji);
          if (this->needQuaternion_ == true) {
            StuntDouble::setQ((StuntDouble *)this_00,(Quat4d *)&ji);
          }
        }
        break;
      case 's':
        RVar8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        lVar6 = (long)(this_00->super_StuntDouble).localIndex_;
        lVar4 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                 atomData).sitePotential.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start +
                         (this_00->super_StuntDouble).storage_);
        goto LAB_00137049;
      case 't':
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&ji);
        ji.super_Vector<double,_3U>.data_[0] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        ji.super_Vector<double,_3U>.data_[1] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        ji.super_Vector<double,_3U>.data_[2] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        StuntDouble::setTrq((StuntDouble *)this_00,&ji);
        break;
      case 'u':
        RVar8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        lVar6 = (long)(this_00->super_StuntDouble).localIndex_;
        lVar4 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                 atomData).particlePot.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start +
                         (this_00->super_StuntDouble).storage_);
LAB_00137049:
        *(RealType *)(lVar4 + lVar6 * 8) = RVar8;
        break;
      case 'v':
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&ji);
        ji.super_Vector<double,_3U>.data_[0] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        ji.super_Vector<double,_3U>.data_[1] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        ji.super_Vector<double,_3U>.data_[2] = StringTokenizer::nextTokenAsDouble(&tokenizer);
        if (this->needVel_ == true) {
          StuntDouble::setVel((StuntDouble *)this_00,&ji);
        }
        break;
      case 'w':
        RVar8 = StringTokenizer::nextTokenAsDouble(&tokenizer);
        if ((this_00->super_StuntDouble).objType_ < otRigidBody) {
          pAVar5 = (Atom *)__dynamic_cast(this_00,&StuntDouble::typeinfo,&Atom::typeinfo,0);
          bVar1 = Atom::isFluctuatingCharge(pAVar5);
          if (bVar1) {
            lVar6 = (long)(this_00->super_StuntDouble).localIndex_;
            lVar4 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).flucQVel.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (this_00->super_StuntDouble).storage_);
            goto LAB_00137049;
          }
        }
      }
    }
    if ((this_00->super_StuntDouble).objType_ == otRigidBody) {
      if (this->needPos_ == true) {
        RigidBody::updateAtoms(this_00);
      }
      if (this->needVel_ == true) {
        RigidBody::updateAtomVel(this_00);
      }
    }
    std::__cxx11::string::~string((string *)&type);
  }
  StringTokenizer::~StringTokenizer(&tokenizer);
  return;
}

Assistant:

void DumpReader::parseDumpLine(const std::string& line) {
    StringTokenizer tokenizer(line);
    int nTokens;

    nTokens = tokenizer.countTokens();

    if (nTokens < 2) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpReader Error: Not enough Tokens.\n%s\n", line.c_str());
      painCave.isFatal = 1;
      simError();
    }

    int index = tokenizer.nextTokenAsInt();

    StuntDouble* sd = info_->getIOIndexToIntegrableObject(index);

    if (sd == NULL) { return; }
    std::string type = tokenizer.nextToken();
    int size         = type.size();

    size_t found;

    if (needPos_) {
      found = type.find("p");
      if (found == std::string::npos) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: StuntDouble %d has no Position\n"
                 "\tField (\"p\") specified.\n%s\n",
                 index, line.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }

    if (sd->isDirectional()) {
      if (needQuaternion_) {
        found = type.find("q");
        if (found == std::string::npos) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpReader Error: Directional StuntDouble %d has no\n"
                   "\tQuaternion Field (\"q\") specified.\n%s\n",
                   index, line.c_str());
          painCave.isFatal = 1;
          simError();
        }
      }
    }

    for (int i = 0; i < size; ++i) {
      switch (type[i]) {
      case 'p': {
        Vector3d pos;
        pos[0] = tokenizer.nextTokenAsDouble();
        pos[1] = tokenizer.nextTokenAsDouble();
        pos[2] = tokenizer.nextTokenAsDouble();
        if (needPos_) { sd->setPos(pos); }
        break;
      }
      case 'v': {
        Vector3d vel;
        vel[0] = tokenizer.nextTokenAsDouble();
        vel[1] = tokenizer.nextTokenAsDouble();
        vel[2] = tokenizer.nextTokenAsDouble();
        if (needVel_) { sd->setVel(vel); }
        break;
      }

      case 'q': {
        Quat4d q;
        if (sd->isDirectional()) {
          q[0] = tokenizer.nextTokenAsDouble();
          q[1] = tokenizer.nextTokenAsDouble();
          q[2] = tokenizer.nextTokenAsDouble();
          q[3] = tokenizer.nextTokenAsDouble();

          RealType qlen = q.length();
          if (qlen < OpenMD::epsilon) {  // check quaternion is not
            // equal to 0

            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "DumpReader Error: initial quaternion error "
                     "(q0^2 + q1^2 + q2^2 + q3^2) ~ 0\n");
            painCave.isFatal = 1;
            simError();
          }

          q.normalize();
          if (needQuaternion_) { sd->setQ(q); }
        }
        break;
      }
      case 'j': {
        Vector3d ji;
        if (sd->isDirectional()) {
          ji[0] = tokenizer.nextTokenAsDouble();
          ji[1] = tokenizer.nextTokenAsDouble();
          ji[2] = tokenizer.nextTokenAsDouble();
          if (needAngMom_) { sd->setJ(ji); }
        }
        break;
      }
      case 'f': {
        Vector3d force;
        force[0] = tokenizer.nextTokenAsDouble();
        force[1] = tokenizer.nextTokenAsDouble();
        force[2] = tokenizer.nextTokenAsDouble();
        sd->setFrc(force);
        break;
      }
      case 't': {
        Vector3d torque;
        torque[0] = tokenizer.nextTokenAsDouble();
        torque[1] = tokenizer.nextTokenAsDouble();
        torque[2] = tokenizer.nextTokenAsDouble();
        sd->setTrq(torque);
        break;
      }
      case 'u': {
        RealType particlePot;
        particlePot = tokenizer.nextTokenAsDouble();
        sd->setParticlePot(particlePot);
        break;
      }
      case 'c': {
        RealType flucQPos;
        flucQPos = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQPos(flucQPos);
        break;
      }
      case 'w': {
        RealType flucQVel;
        flucQVel = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQVel(flucQVel);
        break;
      }
      case 'g': {
        RealType flucQFrc;
        flucQFrc = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQFrc(flucQFrc);
        break;
      }
      case 'e': {
        Vector3d eField;
        eField[0] = tokenizer.nextTokenAsDouble();
        eField[1] = tokenizer.nextTokenAsDouble();
        eField[2] = tokenizer.nextTokenAsDouble();
        // only set the field if we have allocated memory for it
        if (readField_) sd->setElectricField(eField);
        break;
      }
      case 's': {
        RealType sPot;
        sPot = tokenizer.nextTokenAsDouble();
        sd->setSitePotential(sPot);
        break;
      }
      case 'd': {
        RealType density;
        density = tokenizer.nextTokenAsDouble();
        sd->setDensity(density);
        break;
      }

      default: {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: %s is an unrecognized type\n",
                 type.c_str());
        painCave.isFatal = 1;
        simError();
        break;
      }
      }
    }
    if (sd->isRigidBody()) {
      RigidBody* rb = static_cast<RigidBody*>(sd);
      if (needPos_) {
        // This should let us use various atom-based selections even
        // if we have only rigid bodies:
        rb->updateAtoms();
      }
      if (needVel_) { rb->updateAtomVel(); }
    }
  }